

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

void narenas_total_set(uint narenas)

{
  uint narenas_local;
  
  narenas_total.repr = narenas;
  return;
}

Assistant:

static void
narenas_total_set(unsigned narenas) {
	atomic_store_u(&narenas_total, narenas, ATOMIC_RELEASE);
}